

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansv.hpp
# Opt level: O0

void ansv<unsigned_long,2,1,0>
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *in,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *left_nsv,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *right_nsv,
               vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               *lr_mins,comm *comm,size_t nonsv)

{
  allocator<unsigned_long> *this;
  _Map_pointer *__return_storage_ptr__;
  ulong uVar1;
  value_type vVar2;
  value_type vVar3;
  unsigned_long uVar4;
  _Map_pointer pppVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  const_reference pvVar9;
  reference pvVar10;
  size_type sVar11;
  pointer ppVar12;
  size_type sVar13;
  reference pvVar14;
  reference pvVar15;
  reference pvVar16;
  bool bVar17;
  reverse_iterator local_470;
  undefined1 local_450 [8];
  reverse_iterator it_1;
  size_t rcv_idx_1;
  size_t i_7;
  pair<unsigned_long,_unsigned_long> local_418;
  ulong local_408;
  size_t i_6;
  reverse_iterator local_3e0;
  reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
  local_3c0;
  undefined1 local_3a0 [8];
  reverse_iterator it2;
  undefined1 local_360 [8];
  reverse_iterator it;
  size_t iprefix;
  size_t rcv_idx;
  size_t i_5;
  pair<unsigned_long,_unsigned_long> local_320;
  size_type local_310;
  size_t i_4;
  size_t n_right_recv;
  size_t n_left_recv;
  undefined1 local_2f0 [8];
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  recved;
  size_t recv_size;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_displs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_counts;
  size_t end_idx;
  value_type vStack_290;
  int i_3;
  unsigned_long prev_mins_min_1;
  size_t right_idx;
  size_t start_idx;
  value_type vStack_270;
  int i_2;
  unsigned_long prev_mins_min;
  size_t left_idx;
  value_type_conflict local_258;
  undefined1 local_250 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_displs;
  value_type_conflict local_230;
  undefined1 local_228 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_counts;
  vector<unsigned_long,_std::allocator<unsigned_long>_> allmins;
  unsigned_long local_min;
  iterator local_1e8;
  iterator local_1c8;
  __normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
  local_1a8;
  const_iterator local_1a0;
  size_type local_198;
  size_t n_right_mins;
  pair<unsigned_long,_unsigned_long> local_188;
  reverse_iterator local_178;
  reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
  local_158;
  ulong local_138;
  size_t i_1;
  size_t n_left_mins;
  reverse_iterator local_120;
  reverse_iterator local_100;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_e0;
  unsigned_long local_c8;
  pair<unsigned_long,_unsigned_long> local_c0;
  size_type local_b0;
  size_t i;
  _Map_pointer local_98;
  size_t prefix;
  size_t local_size;
  deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  q;
  size_t nonsv_local;
  comm *comm_local;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  *lr_mins_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *right_nsv_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *left_nsv_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_local;
  
  q.
  super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)nonsv;
  std::
  deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::deque((deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           *)&local_size);
  prefix = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in);
  local_98 = (_Map_pointer)mxx::exscan<unsigned_long>(&prefix,comm);
  for (local_b0 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in);
      local_b0 != 0; local_b0 = local_b0 - 1) {
    while( true ) {
      bVar6 = std::
              deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ::empty((deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                       *)&local_size);
      bVar17 = false;
      if (!bVar6) {
        pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (in,local_b0 - 1);
        uVar1 = *pvVar9;
        pvVar10 = std::
                  deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ::back((deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          *)&local_size);
        bVar17 = uVar1 < pvVar10->first;
      }
      if (!bVar17) break;
      std::
      deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ::pop_back((deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  *)&local_size);
    }
    while( true ) {
      bVar6 = std::
              deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ::empty((deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                       *)&local_size);
      bVar17 = false;
      if (!bVar6) {
        pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (in,local_b0 - 1);
        vVar2 = *pvVar9;
        pvVar10 = std::
                  deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ::back((deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          *)&local_size);
        bVar17 = vVar2 == pvVar10->first;
      }
      if (!bVar17) break;
      std::
      deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ::pop_back((deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  *)&local_size);
    }
    pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in,local_b0 - 1)
    ;
    local_c8 = (long)local_98 + (local_b0 - 1);
    std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long,_true>(&local_c0,pvVar9,&local_c8);
    std::
    deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::push_back((deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 *)&local_size,&local_c0);
  }
  std::
  deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::rbegin(&local_100,
           (deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            *)&local_size);
  std::
  deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::rend(&local_120,
         (deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          *)&local_size);
  std::allocator<std::pair<unsigned_long,_unsigned_long>_>::allocator
            ((allocator<std::pair<unsigned_long,_unsigned_long>_> *)((long)&n_left_mins + 7));
  std::
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  ::
  vector<std::reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,unsigned_long>,std::pair<unsigned_long,unsigned_long>&,std::pair<unsigned_long,unsigned_long>*>>,void>
            ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
              *)&local_e0,&local_100,&local_120,
             (allocator<std::pair<unsigned_long,_unsigned_long>_> *)((long)&n_left_mins + 7));
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::operator=(lr_mins,&local_e0);
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::~vector(&local_e0);
  std::allocator<std::pair<unsigned_long,_unsigned_long>_>::~allocator
            ((allocator<std::pair<unsigned_long,_unsigned_long>_> *)((long)&n_left_mins + 7));
  i_1 = std::
        deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ::size((deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                *)&local_size);
  if (i_1 == 0) {
    __assert_fail("n_left_mins >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/ansv.hpp"
                  ,0x60,
                  "void ansv(const std::vector<T> &, std::vector<size_t> &, std::vector<size_t> &, std::vector<std::pair<T, size_t>> &, const mxx::comm &, size_t) [T = unsigned long, left_type = 2, right_type = 1, indexing_type = 0]"
                 );
  }
  std::
  deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::clear((deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           *)&local_size);
  for (local_138 = 0; uVar1 = local_138,
      sVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in), uVar1 < sVar11;
      local_138 = local_138 + 1) {
    while( true ) {
      bVar6 = std::
              deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ::empty((deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                       *)&local_size);
      bVar17 = false;
      if (!bVar6) {
        pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (in,local_138);
        uVar1 = *pvVar9;
        pvVar10 = std::
                  deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ::back((deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          *)&local_size);
        bVar17 = uVar1 < pvVar10->first;
      }
      if (!bVar17) break;
      std::
      deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ::pop_back((deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  *)&local_size);
    }
    while( true ) {
      sVar11 = std::
               deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ::size((deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                       *)&local_size);
      bVar17 = false;
      if (1 < sVar11) {
        pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (in,local_138);
        vVar2 = *pvVar9;
        pvVar10 = std::
                  deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ::back((deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          *)&local_size);
        bVar17 = false;
        if (vVar2 == pvVar10->first) {
          pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (in,local_138);
          vVar2 = *pvVar9;
          std::
          deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ::rbegin(&local_178,
                   (deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    *)&local_size);
          std::
          reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
          ::operator+(&local_158,&local_178,1);
          ppVar12 = std::
                    reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
                    ::operator->(&local_158);
          bVar17 = vVar2 == ppVar12->first;
        }
      }
      if (!bVar17) break;
      std::
      deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ::pop_back((deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  *)&local_size);
    }
    pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in,local_138);
    n_right_mins = (long)local_98 + local_138;
    std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long,_true>
              (&local_188,pvVar9,&n_right_mins);
    std::
    deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::push_back((deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 *)&local_size,&local_188);
  }
  local_198 = std::
              deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ::size((deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      *)&local_size);
  local_1a8._M_current =
       (pair<unsigned_long,_unsigned_long> *)
       std::
       vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
       ::end(lr_mins);
  __gnu_cxx::
  __normal_iterator<std::pair<unsigned_long,unsigned_long>const*,std::vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>>
  ::__normal_iterator<std::pair<unsigned_long,unsigned_long>*>
            ((__normal_iterator<std::pair<unsigned_long,unsigned_long>const*,std::vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>>
              *)&local_1a0,&local_1a8);
  std::
  deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::begin(&local_1c8,
          (deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           *)&local_size);
  std::
  deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::end(&local_1e8,
        (deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
         *)&local_size);
  std::
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  ::
  insert<std::_Deque_iterator<std::pair<unsigned_long,unsigned_long>,std::pair<unsigned_long,unsigned_long>&,std::pair<unsigned_long,unsigned_long>*>,void>
            ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
              *)lr_mins,local_1a0,&local_1c8,&local_1e8);
  pvVar10 = std::
            deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ::front((deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                     *)&local_size);
  allmins.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)pvVar10->first;
  if (local_198 == 0) {
    __assert_fail("n_right_mins >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/ansv.hpp"
                  ,0x76,
                  "void ansv(const std::vector<T> &, std::vector<size_t> &, std::vector<size_t> &, std::vector<std::pair<T, size_t>> &, const mxx::comm &, size_t) [T = unsigned long, left_type = 2, right_type = 1, indexing_type = 0]"
                 );
  }
  std::
  deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::clear((deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           *)&local_size);
  sVar11 = local_198 + i_1;
  sVar13 = std::
           vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ::size(lr_mins);
  if (sVar11 != sVar13) {
    __assert_fail("n_right_mins + n_left_mins == lr_mins.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/ansv.hpp"
                  ,0x78,
                  "void ansv(const std::vector<T> &, std::vector<size_t> &, std::vector<size_t> &, std::vector<std::pair<T, size_t>> &, const mxx::comm &, size_t) [T = unsigned long, left_type = 2, right_type = 1, indexing_type = 0]"
                 );
  }
  mxx::allgather<unsigned_long>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &send_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (unsigned_long *)
             &allmins.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,comm);
  iVar7 = mxx::comm::size(comm);
  local_230 = 0;
  this = (allocator<unsigned_long> *)
         ((long)&send_displs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<unsigned_long>::allocator(this);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_228,(long)iVar7,
             &local_230,this);
  std::allocator<unsigned_long>::~allocator
            ((allocator<unsigned_long> *)
             ((long)&send_displs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  iVar7 = mxx::comm::size(comm);
  local_258 = 0;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)((long)&left_idx + 7));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_250,(long)iVar7,
             &local_258,(allocator<unsigned_long> *)((long)&left_idx + 7));
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)((long)&left_idx + 7));
  iVar7 = mxx::comm::rank(comm);
  if (0 < iVar7) {
    prev_mins_min = 0;
    iVar7 = mxx::comm::rank(comm);
    pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         &send_counts.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,(long)(iVar7 + -1));
    vStack_270 = *pvVar14;
    start_idx._4_4_ = mxx::comm::rank(comm);
    do {
      do {
        uVar4 = prev_mins_min;
        start_idx._4_4_ = start_idx._4_4_ + -1;
        if (start_idx._4_4_ < 0) goto LAB_0018dc91;
        while( true ) {
          bVar17 = false;
          if (prev_mins_min + 1 < i_1) {
            pvVar15 = std::
                      vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      ::operator[](lr_mins,prev_mins_min);
            uVar1 = pvVar15->first;
            pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 &send_counts.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (long)start_idx._4_4_);
            bVar17 = *pvVar14 <= uVar1;
          }
          if (!bVar17) break;
          prev_mins_min = prev_mins_min + 1;
        }
        pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             &send_counts.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,
                             (long)start_idx._4_4_);
      } while (vStack_270 < *pvVar14);
      pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           &send_counts.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,(long)start_idx._4_4_)
      ;
      vStack_270 = *pvVar14;
      pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_228,
                           (long)start_idx._4_4_);
      *pvVar14 = (prev_mins_min - uVar4) + 1;
      pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_250,
                           (long)start_idx._4_4_);
      *pvVar14 = uVar4;
      pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           &send_counts.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,(long)start_idx._4_4_)
      ;
    } while (allmins.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage <= (pointer)*pvVar14);
  }
LAB_0018dc91:
  iVar7 = mxx::comm::rank(comm);
  iVar8 = mxx::comm::size(comm);
  if (iVar7 < iVar8 + -1) {
    sVar11 = std::
             vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ::size(lr_mins);
    prev_mins_min_1 = sVar11 - 1;
    iVar7 = mxx::comm::rank(comm);
    pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         &send_counts.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,(long)(iVar7 + 1));
    vStack_290 = *pvVar14;
    end_idx._4_4_ = mxx::comm::rank(comm);
    do {
      do {
        end_idx._4_4_ = end_idx._4_4_ + 1;
        iVar7 = mxx::comm::size(comm);
        if (iVar7 <= end_idx._4_4_) goto LAB_0018df44;
        recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)prev_mins_min_1;
        iVar7 = mxx::comm::rank(comm);
        if (iVar7 + 1 < end_idx._4_4_) {
          while( true ) {
            sVar11 = std::
                     vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                     ::size(lr_mins);
            bVar17 = false;
            if ((long)recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage + 1U < sVar11) {
              pvVar15 = std::
                        vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                        ::operator[](lr_mins,(long)recv_counts.
                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                             + 1);
              bVar17 = pvVar15->first <= vStack_290;
            }
            if (!bVar17) break;
            recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 (pointer)((long)recv_counts.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
          }
        }
        while( true ) {
          bVar17 = false;
          if (i_1 < prev_mins_min_1) {
            pvVar15 = std::
                      vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      ::operator[](lr_mins,prev_mins_min_1);
            uVar1 = pvVar15->first;
            pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 &send_counts.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (long)end_idx._4_4_);
            bVar17 = *pvVar14 <= uVar1;
          }
          if (!bVar17) break;
          prev_mins_min_1 = prev_mins_min_1 - 1;
        }
        pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             &send_counts.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,(long)end_idx._4_4_)
        ;
      } while (vStack_290 < *pvVar14);
      pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           &send_counts.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,(long)end_idx._4_4_);
      vStack_290 = *pvVar14;
      pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_228,
                           (long)end_idx._4_4_);
      *pvVar14 = (long)recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + (1 - prev_mins_min_1);
      pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_250,
                           (long)end_idx._4_4_);
      *pvVar14 = prev_mins_min_1;
      pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           &send_counts.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,(long)end_idx._4_4_);
    } while (allmins.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage <= (pointer)*pvVar14);
  }
LAB_0018df44:
  mxx::all2all<unsigned_long>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &recv_displs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_228,comm);
  mxx::impl::get_displacements<unsigned_long>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&recv_size,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &recv_displs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       &recv_displs.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
  vVar2 = *pvVar14;
  pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&recv_size);
  vVar3 = *pvVar14;
  recved.
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(vVar2 + vVar3);
  std::allocator<std::pair<unsigned_long,_unsigned_long>_>::allocator
            ((allocator<std::pair<unsigned_long,_unsigned_long>_> *)((long)&n_left_recv + 7));
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::vector((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            *)local_2f0,(size_type)(vVar2 + vVar3),
           (allocator<std::pair<unsigned_long,_unsigned_long>_> *)((long)&n_left_recv + 7));
  std::allocator<std::pair<unsigned_long,_unsigned_long>_>::~allocator
            ((allocator<std::pair<unsigned_long,_unsigned_long>_> *)((long)&n_left_recv + 7));
  pvVar15 = std::
            vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ::operator[](lr_mins,0);
  pvVar16 = std::
            vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ::operator[]((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          *)local_2f0,0);
  mxx::all2allv<std::pair<unsigned_long,unsigned_long>>
            (pvVar15,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_228,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_250,pvVar16,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &recv_displs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&recv_size,comm);
  iVar7 = mxx::comm::rank(comm);
  pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&recv_size,
                       (long)iVar7);
  n_right_recv = *pvVar14;
  i_4 = (long)recved.
              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage - n_right_recv;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(left_nsv,prefix);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(right_nsv,prefix);
  std::
  deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::clear((deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           *)&local_size);
  for (local_310 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in);
      local_310 != 0; local_310 = local_310 - 1) {
    pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (in,local_310 - 1);
    update_nsv_queue<unsigned_long,2>
              (left_nsv,(deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                         *)&local_size,pvVar9,(long)local_98 + (local_310 - 1),(size_t)local_98);
    pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (in,local_310 - 1);
    i_5 = (long)local_98 + (local_310 - 1);
    std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long,_true>(&local_320,pvVar9,&i_5);
    std::
    deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::push_back((deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 *)&local_size,&local_320);
  }
  rcv_idx = 0;
  while ((rcv_idx < n_right_recv &&
         (bVar17 = std::
                   deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   ::empty((deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                            *)&local_size), !bVar17))) {
    iprefix = (n_right_recv - rcv_idx) - 1;
    pvVar15 = std::
              vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ::operator[]((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                            *)local_2f0,iprefix);
    pvVar16 = std::
              vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ::operator[]((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                            *)local_2f0,iprefix);
    update_nsv_queue<unsigned_long,2>
              (left_nsv,(deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                         *)&local_size,&pvVar15->first,pvVar16->second,(size_t)local_98);
    bVar17 = std::
             deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ::empty((deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      *)&local_size);
    if (!bVar17) {
      pvVar15 = std::
                vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ::operator[]((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                              *)local_2f0,iprefix);
      uVar4 = pvVar15->first;
      pvVar10 = std::
                deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ::back((deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                        *)&local_size);
      if (uVar4 == pvVar10->first) {
        while( true ) {
          bVar17 = false;
          if (iprefix != 0) {
            pvVar15 = std::
                      vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      ::operator[]((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                    *)local_2f0,iprefix);
            uVar4 = pvVar15->first;
            pvVar15 = std::
                      vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      ::operator[]((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                    *)local_2f0,iprefix - 1);
            bVar17 = uVar4 == pvVar15->first;
          }
          if (!bVar17) break;
          rcv_idx = rcv_idx + 1;
          iprefix = (n_right_recv - rcv_idx) - 1;
        }
        while( true ) {
          bVar6 = std::
                  deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ::empty((deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                           *)&local_size);
          bVar17 = false;
          if (!bVar6) {
            pvVar10 = std::
                      deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      ::back((deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                              *)&local_size);
            uVar4 = pvVar10->first;
            pvVar15 = std::
                      vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      ::operator[]((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                    *)local_2f0,iprefix);
            bVar17 = uVar4 == pvVar15->first;
          }
          if (!bVar17) break;
          pvVar15 = std::
                    vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ::operator[]((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                  *)local_2f0,iprefix);
          uVar4 = pvVar15->second;
          pvVar10 = std::
                    deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ::back((deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                            *)&local_size);
          pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              (left_nsv,pvVar10->second - (long)local_98);
          *pvVar14 = uVar4;
          std::
          deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ::pop_back((deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      *)&local_size);
        }
      }
    }
    rcv_idx = rcv_idx + 1;
  }
  it.current._M_node = local_98;
  std::
  deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::rbegin((reverse_iterator *)local_360,
           (deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            *)&local_size);
  while( true ) {
    __return_storage_ptr__ = &it2.current._M_node;
    std::
    deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::rend((reverse_iterator *)__return_storage_ptr__,
           (deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            *)&local_size);
    bVar17 = std::operator!=((reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
                              *)local_360,
                             (reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
                              *)__return_storage_ptr__);
    if (!bVar17) break;
    std::
    reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
    ::reverse_iterator((reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
                        *)local_3a0,
                       (reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
                        *)local_360);
    while( true ) {
      std::
      reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
      ::operator+(&local_3c0,
                  (reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
                   *)local_3a0,1);
      std::
      deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ::rend(&local_3e0,
             (deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              *)&local_size);
      bVar6 = std::operator!=(&local_3c0,&local_3e0);
      bVar17 = false;
      if (bVar6) {
        ppVar12 = std::
                  reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
                  ::operator->((reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
                                *)local_360);
        uVar4 = ppVar12->first;
        std::
        reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
        ::operator+((reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
                     *)&i_6,(reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
                             *)local_3a0,1);
        ppVar12 = std::
                  reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
                  ::operator->((reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
                                *)&i_6);
        bVar17 = uVar4 == ppVar12->first;
      }
      pppVar5 = q.
                super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node;
      if (!bVar17) break;
      std::
      reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
      ::operator++((reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
                    *)local_3a0);
      ppVar12 = std::
                reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
                ::operator->((reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
                              *)local_360);
      uVar4 = ppVar12->second;
      ppVar12 = std::
                reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
                ::operator->((reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
                              *)local_3a0);
      pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          (left_nsv,ppVar12->second - (long)it.current._M_node);
      *pvVar14 = uVar4;
    }
    ppVar12 = std::
              reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
              ::operator->((reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
                            *)local_360);
    pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        (left_nsv,ppVar12->second - (long)it.current._M_node);
    *pvVar14 = (value_type)pppVar5;
    local_360 = local_3a0;
    it.current._M_cur = it2.current._M_cur;
    it.current._M_first = it2.current._M_first;
    it.current._M_last = it2.current._M_last;
    std::
    reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
    ::operator++((reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
                  *)local_360);
  }
  std::
  deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::clear((deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           *)&local_size);
  for (local_408 = 0; uVar1 = local_408,
      sVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in), uVar1 < sVar11;
      local_408 = local_408 + 1) {
    pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in,local_408);
    update_nsv_queue<unsigned_long,1>
              (right_nsv,
               (deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                *)&local_size,pvVar9,(long)local_98 + local_408,(size_t)local_98);
    pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in,local_408);
    i_7 = (long)local_98 + local_408;
    std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long,_true>(&local_418,pvVar9,&i_7);
    std::
    deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::push_back((deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 *)&local_size,&local_418);
  }
  for (rcv_idx_1 = 0; rcv_idx_1 < i_4; rcv_idx_1 = rcv_idx_1 + 1) {
    it_1.current._M_node = (_Map_pointer)(n_right_recv + rcv_idx_1);
    bVar17 = std::
             deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ::empty((deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      *)&local_size);
    if (bVar17) break;
    pvVar15 = std::
              vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ::operator[]((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                            *)local_2f0,(size_type)it_1.current._M_node);
    pvVar16 = std::
              vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ::operator[]((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                            *)local_2f0,(size_type)it_1.current._M_node);
    update_nsv_queue<unsigned_long,1>
              (right_nsv,
               (deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                *)&local_size,&pvVar15->first,pvVar16->second,(size_t)local_98);
  }
  std::
  deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::rbegin((reverse_iterator *)local_450,
           (deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            *)&local_size);
  while( true ) {
    std::
    deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::rend(&local_470,
           (deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            *)&local_size);
    bVar17 = std::operator!=((reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
                              *)local_450,&local_470);
    pppVar5 = q.
              super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
    if (!bVar17) break;
    ppVar12 = std::
              reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
              ::operator->((reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
                            *)local_450);
    pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        (right_nsv,ppVar12->second - (long)it.current._M_node);
    *pvVar14 = (value_type)pppVar5;
    std::
    reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
    ::operator++((reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
                  *)local_450);
  }
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::operator=(lr_mins,(vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                       *)local_2f0);
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::~vector((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             *)local_2f0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&recv_size);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &recv_displs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_250);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_228);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &send_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::
  deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::~deque((deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            *)&local_size);
  return;
}

Assistant:

void ansv(const std::vector<T>& in, std::vector<size_t>& left_nsv, std::vector<size_t>& right_nsv, std::vector<std::pair<T,size_t> >& lr_mins, const mxx::comm& comm, size_t nonsv = 0) {
    std::deque<std::pair<T,size_t> > q;
    size_t local_size = in.size();
    size_t prefix = mxx::exscan(local_size, comm);

    /*****************************************************************
     *  Step 1: Locally calculate ANSV and save un-matched elements  *
     *****************************************************************/

    // backwards direction (left mins)
    for (size_t i = in.size(); i > 0; --i) {
        while (!q.empty() && in[i-1] < q.back().first)
            q.pop_back();
        if (right_type == furthest_eq) {
            // remove all equal elements but the last
            while (q.size() >= 2 && in[i-1] == q.back().first && in[i-1] == (q.rbegin()+1)->first) {
                q.pop_back();
            }
        } else {
            while (!q.empty() && in[i-1] == q.back().first)
                q.pop_back();
        }
        q.push_back(std::pair<T, size_t>(in[i-1], prefix+i-1));
    }
    // add results to left_mins
    lr_mins = std::vector<std::pair<T,size_t>>(q.rbegin(), q.rend());
    size_t n_left_mins = q.size();
    assert(n_left_mins >= 1);
    q.clear();

    // forward direction (right mins)
    for (size_t i = 0; i < in.size(); ++i) {
        while (!q.empty() && in[i] < q.back().first)
            q.pop_back();
        if (left_type == furthest_eq) {
            while (q.size() >= 2 && in[i] == q.back().first && in[i] == (q.rbegin()+1)->first) {
                // remove all but the last one that is equal, TODO: can be `if` instead
                q.pop_back();
            }
        } else {
            while (!q.empty() && in[i] == q.back().first)
                q.pop_back();
        }
        q.push_back(std::pair<T, size_t>(in[i], prefix+i));
    }
    // add results to right_mins
    size_t n_right_mins = q.size();
    lr_mins.insert(lr_mins.end(), q.begin(), q.end());
    T local_min = q.front().first;
    assert(n_right_mins >= 1);
    q.clear();
    assert(n_right_mins + n_left_mins == lr_mins.size());

    /***************************************************************
     *  Step 2: communicate un-matched elements to correct target  *
     ***************************************************************/

    // allgather min and max of all left and right mins
    //assert(local_min == lr_mins.front().first);
    std::vector<T> allmins = mxx::allgather(local_min, comm);
    std::vector<size_t> send_counts(comm.size(), 0);
    std::vector<size_t> send_displs(comm.size(), 0);

    // calculate which processor to exchange unmatched left_mins and right_mins with
    // 1) calculate communication parameters for left processes
    if (comm.rank() > 0) {
        size_t left_idx = 0;
        T prev_mins_min = allmins[comm.rank()-1];
        for (int i = comm.rank()-1; i >= 0; --i) {
            size_t start_idx = left_idx;
            // move start back to other `equal` elements (there can be at most 2)
            if (right_type == furthest_eq && i < comm.rank()-1) {
                if (start_idx > 0 && lr_mins[start_idx-1].first <= prev_mins_min) {
                    --start_idx;
                }
            }
            while (left_idx+1 < n_left_mins && lr_mins[left_idx].first >= allmins[i]) {
                ++left_idx;
            }
            // don't send anything if min is dominated by previous
            if (allmins[i] > prev_mins_min) {
                continue;
            } else {
                prev_mins_min = allmins[i];
            }

            // send all from [left_idx, start_idx] (inclusive) to proc `i`
            send_counts[i] = left_idx - start_idx + 1;
            send_displs[i] = start_idx;

            // set comm parameters
            if (allmins[i] < local_min) {
                break;
            }
        }
    }

    // 2) calculate communication parameters for right process
    if (comm.rank() < comm.size()-1) {
        size_t right_idx = lr_mins.size()-1; // n_left_mins;
        T prev_mins_min = allmins[comm.rank()+1];
        for (int i = comm.rank()+1; i < comm.size(); ++i) {
            // find the range which should be send
            size_t end_idx = right_idx;
            if (left_type == furthest_eq && i > comm.rank()+1) {
                // move start back to other `equal` elements
                while (end_idx+1 < lr_mins.size() && lr_mins[end_idx+1].first <= prev_mins_min) {
                    ++end_idx;
                }
            }
            while (right_idx > n_left_mins && lr_mins[right_idx].first >= allmins[i]) {
                --right_idx;
            }

            // don't send if the minimum of `i` is dominated by a prev min right of me
            if (prev_mins_min < allmins[i]) {
                continue;
            } else {
                prev_mins_min = allmins[i];
            }

            // now right_idx is the first one that is smaller than the min of `i`
            // send all elements from [start_idx, right_idx]
            send_counts[i] = end_idx - right_idx + 1;
            send_displs[i] = right_idx;

            // can stop if an overall smaller min than my own has been found
            if (allmins[i] < local_min) {
                break;
            }
        }
    }

    // exchange lr_mins via all2all
    std::vector<size_t> recv_counts = mxx::all2all(send_counts, comm);
    std::vector<size_t> recv_displs = mxx::impl::get_displacements(recv_counts);
    size_t recv_size = recv_counts.back() + recv_displs.back();
    std::vector<std::pair<T, size_t>> recved(recv_size);
    mxx::all2allv(&lr_mins[0], send_counts, send_displs, &recved[0], recv_counts, recv_displs, comm);

    // solve locally given the exchanged values (by prefilling min-queue before running locally)
    size_t n_left_recv = recv_displs[comm.rank()];
    size_t n_right_recv = recv_size - n_left_recv;


    /***************************************************************
     *  Step 3: Again solve ANSV locally and use lr_mins as tails  *
     ***************************************************************/

    left_nsv.resize(local_size);
    right_nsv.resize(local_size);

    q.clear();
    // iterate backwards to get the nearest smaller element to left for each element
    // TODO: this doesn't really require pairs in the queue (index suffices)
    for (size_t i = in.size(); i > 0; --i) {
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,left_type>(left_nsv, q, in[i-1], prefix+i-1, prefix);
            q.push_back(std::pair<T, size_t>(in[i-1], prefix+i-1));
        } else { // indexing_type == local_indexing
            // prefix=0 for local indexing
            update_nsv_queue<T,left_type>(left_nsv, q, in[i-1], i-1, 0);
            q.push_back(std::pair<T, size_t>(in[i-1], i-1));
        }
    }

    // now go backwards through the right-mins from the previous processors,
    // in order to resolve all local elements
    for (size_t i = 0; i < n_left_recv; ++i) {
        if (q.empty()) {
            break;
        }
        size_t rcv_idx = n_left_recv - i - 1;

        // set nsv for all larger elements in the queue
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,left_type>(left_nsv, q, recved[rcv_idx].first, recved[rcv_idx].second, prefix);
        } else { // indexing_type == local_indexing
            // prefix = 0, recv.2nd = local_size+rcv_idx,
            update_nsv_queue<T,left_type>(left_nsv, q, recved[rcv_idx].first, local_size + rcv_idx, 0);
        }

        if (left_type == furthest_eq) {
            if (!q.empty() && recved[rcv_idx].first == q.back().first) {
                // skip till furthest of an equal range
                while (rcv_idx != 0 && recved[rcv_idx].first == recved[rcv_idx-1].first) {
                    i++;
                    rcv_idx = n_left_recv - i - 1;
                }
                // setting this as the furthest_eq for all equal elements in the queue
                // and removing all equal elements from the queue
                while (!q.empty() && q.back().first == recved[rcv_idx].first) {
                    if (indexing_type == global_indexing) {
                        left_nsv[q.back().second - prefix] = recved[rcv_idx].second;
                    } else { // indexing_type == local_indexing
                        left_nsv[q.back().second] = local_size + rcv_idx;
                    }
                    q.pop_back();
                }
            }
        }
    }

    // elements still in the queue do not have a smaller value to the left
    //  -> set these to a special value and handle case if furthest_eq
    //     elements are still waiting in queue
    const size_t iprefix = (indexing_type == global_indexing) ? prefix : 0;
    for (auto it = q.rbegin(); it != q.rend(); ++it) {
        if (left_type == furthest_eq) {
                auto it2 = it;
                // set left most as furthest_eq for all equal elements
                while(it2+1 != q.rend() && it->first == (it2+1)->first) {
                    ++it2;
                    left_nsv[it2->second - iprefix] = it->second;
                }
                left_nsv[it->second - iprefix] = nonsv;
                it = it2;
        } else {
            left_nsv[it->second - iprefix] = nonsv;
        }
    }

    // iterate forwards to get the nearest smaller value to the right for each element
    q.clear();
    for (size_t i = 0; i < in.size(); ++i) {
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,right_type>(right_nsv, q, in[i], prefix+i, prefix);
            q.push_back(std::pair<T, size_t>(in[i], prefix+i));
        } else { // indexing_type == local_indexing
            // handle as if prefix = 0
            update_nsv_queue<T,right_type>(right_nsv, q, in[i], i, 0);
            q.push_back(std::pair<T, size_t>(in[i], i));
        }
    }

    // now go forwards through left-mins of succeeding processors
    for (size_t i = 0; i < n_right_recv; ++i) {
        size_t rcv_idx = n_left_recv + i;
        if (q.empty()) {
            break;
        }
        // set nsv for all larger elements in the queue
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,right_type>(right_nsv, q, recved[rcv_idx].first, recved[rcv_idx].second, prefix);
        } else { // indexing_type == local_indexing
            update_nsv_queue<T,right_type>(right_nsv, q, recved[rcv_idx].first, local_size+rcv_idx, 0);
        }

        if (right_type == furthest_eq) {
            if (!q.empty() && recved[rcv_idx].first == q.back().first) {
                // skip till furthest of an equal range
                while (i+1 < n_right_recv  && recved[rcv_idx].first == recved[rcv_idx+1].first) {
                    i++;
                    rcv_idx = n_left_recv + i;
                }
                // setting this as the furthest_eq for all equal elements in the queue
                // and removing all equal elements from the queue
                while (!q.empty() && q.back().first == recved[rcv_idx].first) {
                    if (indexing_type == global_indexing) {
                        right_nsv[q.back().second - prefix] = recved[rcv_idx].second;
                    } else { // indexing_type == local_indexing
                        right_nsv[q.back().second] = local_size+rcv_idx;
                    }
                    q.pop_back();
                }
            }
        }
    }

    // elements still in the queue do not have a smaller value to the left
    // -> set these to a special value and handle case if furthest_eq elements
    // are still waiting in queue
    for (auto it = q.rbegin(); it != q.rend(); ++it) {
        if (right_type == furthest_eq) {
                auto it2 = it;
                // set left most as furthest_eq for all equal elements
                while(it2+1 != q.rend() && it->first == (it2+1)->first) {
                    ++it2;
                    right_nsv[it2->second - iprefix] = it->second;
                }
                right_nsv[it->second - iprefix] = nonsv;
                it = it2;
        } else {
            right_nsv[it->second - iprefix] = nonsv;
        }
    }

    lr_mins = recved;
}